

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5ExprClearPoslists(Fts5ExprNode *pNode)

{
  int *in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  if ((*in_RDI == 4) || (*in_RDI == 9)) {
    *(undefined4 *)(*(long *)(*(long *)(in_RDI + 8) + 0x18) + 0x10) = 0;
  }
  else {
    for (iVar1 = 0; iVar1 < in_RDI[10]; iVar1 = iVar1 + 1) {
      fts5ExprClearPoslists((Fts5ExprNode *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    }
  }
  return;
}

Assistant:

static void fts5ExprClearPoslists(Fts5ExprNode *pNode){
  if( pNode->eType==FTS5_TERM || pNode->eType==FTS5_STRING ){
    pNode->pNear->apPhrase[0]->poslist.n = 0;
  }else{
    int i;
    for(i=0; i<pNode->nChild; i++){
      fts5ExprClearPoslists(pNode->apChild[i]);
    }
  }
}